

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::RandomFragmentOpTests::init(RandomFragmentOpTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  RandomFragmentOpCase *this_00;
  long *extraout_RAX;
  long *plVar1;
  deUint32 seed;
  int iVar2;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  seed = 0;
  iVar2 = 0;
  do {
    this_00 = (RandomFragmentOpCase *)operator_new(200);
    context = (this->super_TestCaseGroup).m_context;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    RandomFragmentOpCase::RandomFragmentOpCase
              (this_00,context,(char *)local_1c8,glcts::fixed_sample_locations_values + 1,seed);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    plVar1 = local_1b8;
    if (local_1c8 != plVar1) {
      operator_delete(local_1c8,local_1b8[0] + 1);
      plVar1 = extraout_RAX;
    }
    iVar2 = iVar2 + 1;
    seed = seed + 10;
  } while (iVar2 != 100);
  return (int)plVar1;
}

Assistant:

void RandomFragmentOpTests::init (void)
{
	for (int ndx = 0; ndx < 100; ndx++)
		addChild(new RandomFragmentOpCase(m_context, de::toString(ndx).c_str(), "", (deUint32)(ndx*NUM_ITERATIONS_PER_CASE)));
}